

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

Aig_Man_t * Saig_ManDupCones(Aig_Man_t *pAig,int *pPos,int nPos)

{
  Vec_Ptr_t *p;
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pAVar3;
  char *pcVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int iVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  
  pAVar3 = pAig;
  p_00 = Vec_PtrAlloc((int)pAig);
  iVar7 = (int)pAVar3;
  p_01 = Vec_PtrAlloc(iVar7);
  p_02 = Vec_PtrAlloc(iVar7);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < nPos) {
    uVar9 = (ulong)(uint)nPos;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    pAVar2 = Aig_ManCo(pAig,pPos[uVar8]);
    Vec_PtrPush(p_02,pAVar2);
  }
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  for (iVar7 = 0; iVar7 < p_02->nSize; iVar7 = iVar7 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_02,iVar7);
    Saig_ManDupCones_rec(pAig,pAVar2,p_00,p_01,p_02);
  }
  pAVar3 = Aig_ManStart(p_01->nSize);
  pcVar4 = Abc_UtilStrsav(pAig->pName);
  pAVar3->pName = pcVar4;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar3->pConst1;
  for (iVar7 = 0; i = nPos, iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(p_00,iVar7);
    pAVar2 = Aig_ObjCreateCi(pAVar3);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar2;
  }
  while( true ) {
    if (p_02->nSize <= i) {
      for (iVar7 = 0; iVar7 < p_01->nSize; iVar7 = iVar7 + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar7);
        pAVar6 = Aig_ObjChild0Copy(pAVar2);
        p1 = Aig_ObjChild1Copy(pAVar2);
        pAVar6 = Aig_And(pAVar3,pAVar6,p1);
        (pAVar2->field_5).pData = pAVar6;
      }
      for (iVar7 = 0; iVar7 < p_02->nSize; iVar7 = iVar7 + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_02,iVar7);
        pAVar2 = Aig_ObjChild0Copy(pAVar2);
        Aig_ObjCreateCo(pAVar3,pAVar2);
      }
      Aig_ManSetRegNum(pAVar3,p_02->nSize - nPos);
      Vec_PtrFree(p_00);
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_02);
      return pAVar3;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_02,i);
    pAVar6 = Aig_ObjCreateCi(pAVar3);
    if (((*(uint *)&pAVar2->field_0x18 & 7) != 3) ||
       (iVar7 = Aig_ObjCioId(pAVar2), iVar7 < pAig->nTruePos)) break;
    p = pAig->vCis;
    iVar7 = pAig->nTruePis;
    iVar1 = Aig_ObjCioId(pAVar2);
    pvVar5 = Vec_PtrEntry(p,(iVar7 + iVar1) - pAig->nTruePos);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
    i = i + 1;
  }
  __assert_fail("Saig_ObjIsLi(p, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Man_t * Saig_ManDupCones( Aig_Man_t * pAig, int * pPos, int nPos )
{
    Aig_Man_t * pAigNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Aig_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Aig_ManCo(pAig, pPos[i]) );

    // mark internal nodes
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManDupCones_rec( pAig, pObj, vLeaves, vNodes, vRoots );

    // start the new manager
    pAigNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create PIs
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // create LOs
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vRoots, pObj, i, nPos )
        Saig_ObjLiToLo(pAig, pObj)->pData = Aig_ObjCreateCi( pAigNew );
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManSetRegNum( pAigNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pAigNew;

}